

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate1<std::complex<double>_>::QRotationGate1
          (QRotationGate1<std::complex<double>_> *this,int qubit,real_type cos,real_type sin,
          bool fixed)

{
  bool fixed_local;
  real_type sin_local;
  real_type cos_local;
  int qubit_local;
  QRotationGate1<std::complex<double>_> *this_local;
  
  QGate1<std::complex<double>_>::QGate1(&this->super_QGate1<std::complex<double>_>,qubit);
  QAdjustable::QAdjustable
            ((QAdjustable *)&(this->super_QGate1<std::complex<double>_>).field_0xc,fixed);
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0016abf8;
  QRotation<double>::QRotation(&this->rotation_,cos,sin);
  return;
}

Assistant:

QRotationGate1( const int qubit , const real_type cos ,
                        const real_type sin , const bool fixed = false )
        : QGate1< T >( qubit )
        , rotation_( cos , sin )
        , QAdjustable( fixed )
        { }